

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directive.cpp
# Opt level: O2

void __thiscall ast::Dir_space::Dir_space(Dir_space *this,Expression *s,Expression *i,Location left)

{
  ushort uVar1;
  Expression *pEVar2;
  long lVar3;
  int iVar4;
  allocator local_31;
  string local_30;
  
  (this->super_Directive).super_Statement.label._M_dataplus._M_p =
       (pointer)&(this->super_Directive).super_Statement.label.field_2;
  (this->super_Directive).super_Statement.label._M_string_length = 0;
  (this->super_Directive).super_Statement.label.field_2._M_local_buf[0] = '\0';
  *(undefined4 *)&(this->super_Directive).super_Statement.location.unit = left.unit._0_4_;
  *(undefined4 *)((long)&(this->super_Directive).super_Statement.location.unit + 4) =
       left.unit._4_4_;
  (this->super_Directive).super_Statement.location.line = left.line;
  (this->super_Directive).super_Statement.location.first_column = left.first_column;
  (this->super_Directive).super_Statement.location.last_column = left.last_column;
  *(undefined4 *)&(this->super_Directive).super_Statement.location.field_0x14 = left._20_4_;
  (this->super_Directive).super_Statement.size_in_memory = 0;
  (this->super_Directive).super_Statement._vptr_Statement = (_func_int **)&PTR__Dir_space_0013b8c0;
  this->size = s;
  this->initial = i;
  lVar3 = Sections::current_section;
  (this->super_Directive).super_Statement.section_index =
       *(uint *)(Sections::current_section + 0x20);
  (this->super_Directive).super_Statement.section_offset = *(uint *)(lVar3 + 0x30);
  iVar4 = (*s->_vptr_Expression[3])(s);
  pEVar2 = this->size;
  if ((char)iVar4 == '\0') {
    std::__cxx11::string::string
              ((string *)&local_30,"Size parameter for .space directive must be defined before",
               &local_31);
    error_report(&pEVar2->location,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    uVar1 = (ushort)(this->super_Directive).super_Statement.size_in_memory;
  }
  else {
    uVar1 = (ushort)pEVar2->value;
    (this->super_Directive).super_Statement.size_in_memory = (uint)uVar1;
  }
  Sections::increase((this->super_Directive).super_Statement.section_index,(uint)uVar1);
  return;
}

Assistant:

Dir_space::Dir_space (Expression *s, Expression *i, Location left) :
	Directive {left}, size {s}, initial {i}
{
	section_index = Sections::current_section->number;
	section_offset = Sections::current_section->content_size;
	if (size->evaluate())
		size_in_memory = size->get_value();
	else
		error_report(&size->location, "Size parameter for .space directive must be defined before");
	Sections::increase(section_index, size_in_memory & 0xffff);
}